

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_grana_2010.h
# Opt level: O2

void __thiscall
BBDT<RemSP>::PerformLabelingMem
          (BBDT<RemSP> *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *accesses)

{
  int *piVar1;
  undefined8 uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  Mat1b *pMVar6;
  pointer puVar7;
  pointer piVar8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  void *pvVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  void *in_R8;
  long lVar21;
  int r_1;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int c;
  ulong uVar27;
  int r;
  ulong uVar28;
  bool bVar29;
  double dVar30;
  MemMat<int> img_labels;
  MemMat<unsigned_char> img;
  allocator_type local_181;
  long local_180;
  ulong local_178;
  BBDT<RemSP> *local_170;
  long local_158;
  long local_150;
  long local_148;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_128;
  long local_120;
  long local_118;
  pointer local_110;
  pointer local_108;
  value_type_conflict3 local_100;
  Size local_f8;
  Mat_<int> local_f0;
  Mat local_90 [96];
  
  pMVar6 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  iVar4 = *(int *)&pMVar6->field_0x8;
  lVar24 = (long)iVar4;
  iVar5 = *(int *)&pMVar6->field_0xc;
  lVar17 = (long)iVar5;
  local_128 = accesses;
  RemSP::MemAlloc(((iVar4 + 1) / 2) * ((iVar5 + 1) / 2) + 1);
  RemSP::MemSetup();
  local_170 = this;
  cv::Mat::Mat(local_90,&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->super_Mat);
  MemMat<unsigned_char>::MemMat(&img,(Mat_<unsigned_char> *)local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = **(undefined8 **)
            &((local_170->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x40;
  local_f8.height = (int)uVar2;
  local_f8.width = (int)((ulong)uVar2 >> 0x20);
  MemMat<int>::MemMat(&img_labels,&local_f8,0);
  uVar28 = 0;
  local_180 = lVar24;
  do {
    if (lVar24 <= (long)uVar28) {
      uVar10 = RemSP::MemFlatten();
      (local_170->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar10;
      uVar28 = 0;
      lVar26 = 1;
      do {
        lVar20 = lVar26;
        piVar8 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar7 = RemSP::mem_P_.vec_.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if (lVar24 <= (long)uVar28) {
          local_100 = 0;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0,4,&local_100
                     ,&local_181);
          pvVar9 = local_128;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
                    (local_128,&local_f0);
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_f0);
          dVar30 = MemMat<unsigned_char>::GetTotalAccesses(&img);
          *(pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start =
               (long)(dVar30 - 9.223372036854776e+18) & (long)dVar30 >> 0x3f | (long)dVar30;
          dVar30 = MemMat<int>::GetTotalAccesses(&img_labels);
          (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[1] =
               (long)dVar30 >> 0x3f & (long)(dVar30 - 9.223372036854776e+18) | (long)dVar30;
          dVar30 = RemSP::MemTotalAccesses();
          pvVar14 = (void *)((long)dVar30 >> 0x3f & (long)(dVar30 - 9.223372036854776e+18) |
                            (long)dVar30);
          (pvVar9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
          super__Vector_impl_data._M_start[2] = (unsigned_long)pvVar14;
          cv::Mat_<int>::clone
                    (&local_f0,(__fn *)&img_labels.img_,pvVar14,
                     (int)(long)(dVar30 - 9.223372036854776e+18),in_R8);
          cv::Mat::operator=(&((local_170->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)
                              ->super_Mat,&local_f0.super_Mat);
          cv::Mat::~Mat(&local_f0.super_Mat);
          MemMat<int>::~MemMat(&img_labels);
          MemMat<unsigned_char>::~MemMat(&img);
          return;
        }
        local_178 = uVar28 | 1;
        local_108 = RemSP::mem_P_.vec_.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_110 = RemSP::mem_P_.accesses_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        local_150 = img_labels.accesses_._16_8_ + 4;
        local_158 = img_labels.img_._16_8_ + 4;
        local_118 = img.accesses_._16_8_ + 4;
        local_120 = img.img_._16_8_ + 1;
        for (lVar26 = 0; lVar26 < lVar17; lVar26 = lVar26 + 2) {
          lVar18 = *(long *)img_labels.accesses_._72_8_;
          lVar21 = uVar28 * lVar18 + img_labels.accesses_._16_8_;
          iVar4 = *(int *)(lVar21 + lVar26 * 4);
          *(int *)(lVar21 + lVar26 * 4) = iVar4 + 1;
          lVar13 = *(long *)img_labels.img_._72_8_;
          lVar22 = uVar28 * lVar13 + img_labels.img_._16_8_;
          lVar23 = (long)*(int *)(lVar22 + lVar26 * 4);
          if (lVar23 < 1) {
            *(int *)(lVar21 + lVar26 * 4) = iVar4 + 2;
            *(undefined4 *)(lVar22 + lVar26 * 4) = 0;
            if (lVar26 + 1 < lVar17) {
              piVar1 = (int *)(lVar21 + 4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              *(undefined4 *)(lVar22 + 4 + lVar26 * 4) = 0;
              if ((long)local_178 < lVar24) {
                lVar18 = lVar18 * lVar20 + img_labels.accesses_._16_8_;
                piVar1 = (int *)(lVar18 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                lVar13 = lVar13 * lVar20 + img_labels.img_._16_8_;
                *(undefined4 *)(lVar13 + lVar26 * 4) = 0;
                piVar1 = (int *)(lVar18 + 4 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                *(undefined4 *)(lVar13 + 4 + lVar26 * 4) = 0;
              }
            }
            else if ((long)local_178 < lVar24) {
              piVar1 = (int *)(lVar18 * lVar20 + img_labels.accesses_._16_8_ + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = lVar13 * lVar20 + img_labels.img_._16_8_;
LAB_00189e97:
              *(undefined4 *)(lVar18 + lVar26 * 4) = 0;
            }
          }
          else {
            piVar8[lVar23] = piVar8[lVar23] + 1;
            uVar10 = puVar7[lVar23];
            lVar23 = *(long *)img.accesses_._72_8_;
            lVar16 = uVar28 * lVar23 + img.accesses_._16_8_;
            piVar1 = (int *)(lVar16 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            lVar19 = *(long *)img.img_._72_8_;
            lVar25 = uVar28 * lVar19 + img.img_._16_8_;
            uVar12 = uVar10;
            if (*(char *)(lVar26 + lVar25) == '\0') {
              uVar12 = 0;
            }
            piVar1 = (int *)(lVar21 + lVar26 * 4);
            *piVar1 = *piVar1 + 1;
            *(uint *)(lVar22 + lVar26 * 4) = uVar12;
            lVar24 = local_180;
            if (lVar26 + 1 < lVar17) {
              piVar1 = (int *)(lVar16 + 4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              uVar12 = uVar10;
              if (*(char *)(lVar26 + 1 + lVar25) == '\0') {
                uVar12 = 0;
              }
              piVar1 = (int *)(lVar21 + 4 + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              *(uint *)(lVar22 + 4 + lVar26 * 4) = uVar12;
              if ((long)local_178 < local_180) {
                piVar1 = (int *)(lVar23 * lVar20 + img.accesses_._16_8_ + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                uVar12 = uVar10;
                if (*(char *)(lVar26 + lVar19 * lVar20 + img.img_._16_8_) == '\0') {
                  lVar18 = *(long *)img_labels.accesses_._72_8_;
                  uVar12 = 0;
                }
                piVar1 = (int *)(lVar18 * lVar20 + img_labels.accesses_._16_8_ + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                *(uint *)(*(long *)img_labels.img_._72_8_ * lVar20 + img_labels.img_._16_8_ +
                         lVar26 * 4) = uVar12;
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar20 + local_118 + lVar26 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar26 + *(long *)img.img_._72_8_ * lVar20 + local_120) == '\0') {
                  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar20 + local_150 +
                                  lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(undefined4 *)(*(long *)img_labels.img_._72_8_ * lVar20 + local_158 + lVar26 * 4)
                       = 0;
                }
                else {
                  piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * lVar20 + local_150 +
                                  lVar26 * 4);
                  *piVar1 = *piVar1 + 1;
                  *(uint *)(*(long *)img_labels.img_._72_8_ * lVar20 + local_158 + lVar26 * 4) =
                       uVar10;
                }
              }
            }
            else if ((long)local_178 < local_180) {
              piVar1 = (int *)(lVar23 * lVar20 + img.accesses_._16_8_ + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              cVar3 = *(char *)(lVar26 + lVar19 * lVar20 + img.img_._16_8_);
              piVar1 = (int *)(lVar18 * lVar20 + img_labels.accesses_._16_8_ + lVar26 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = lVar13 * lVar20 + img_labels.img_._16_8_;
              if (cVar3 == '\0') goto LAB_00189e97;
              *(uint *)(lVar18 + lVar26 * 4) = uVar10;
            }
          }
        }
        uVar28 = uVar28 + 2;
        lVar26 = lVar20 + 2;
        in_R8 = (void *)img_labels.img_._72_8_;
        local_148 = lVar20;
      } while( true );
    }
    lVar26 = uVar28 - 1;
    pvVar14 = (void *)(uVar28 - 2);
    uVar15 = uVar28 | 1;
    for (uVar27 = 0; (long)uVar27 < lVar17; uVar27 = uVar27 + 2) {
      lVar20 = *(long *)img.accesses_._72_8_;
      lVar23 = lVar20 * uVar28 + img.accesses_._16_8_;
      piVar1 = (int *)(lVar23 + uVar27 * 4);
      *piVar1 = *piVar1 + 1;
      lVar18 = *(long *)img.img_._72_8_;
      lVar13 = lVar18 * uVar28 + img.img_._16_8_;
      if (*(char *)(uVar27 + lVar13) == '\0') {
        if ((long)uVar15 < lVar24) {
          lVar22 = lVar20 * uVar15 + img.accesses_._16_8_;
          piVar1 = (int *)(lVar22 + uVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar21 = lVar18 * uVar15 + img.img_._16_8_;
          if (*(char *)(uVar27 + lVar21) == '\0') goto LAB_001881bc;
          in_R8 = (void *)(uVar27 | 1);
          if ((lVar17 <= (long)in_R8) ||
             (piVar1 = (int *)(lVar23 + (long)in_R8 * 4), *piVar1 = *piVar1 + 1,
             *(char *)(lVar13 + (long)in_R8) == '\0')) {
            if ((uVar27 != 0) &&
               ((piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ + -4
                                 + uVar27 * 4), *piVar1 = *piVar1 + 1,
                *(char *)(lVar21 + -1 + uVar27) != '\0' ||
                (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ + -4
                                 + uVar27 * 4), *piVar1 = *piVar1 + 1,
                *(char *)(lVar13 + -1 + uVar27) != '\0')))) goto LAB_001886bf;
LAB_00189176:
            uVar10 = RemSP::MemNewLabel();
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar28 +
                             img_labels.accesses_._16_8_ + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = *(long *)img_labels.img_._72_8_ * uVar28 + img_labels.img_._16_8_;
            goto LAB_001896a7;
          }
          if (uVar27 != 0) {
            piVar1 = (int *)(lVar23 + -4 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar13 + -1 + uVar27) != '\0') {
              if (uVar28 == 0) goto LAB_001886bf;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                              (long)in_R8 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = lVar18 * lVar26 + img.img_._16_8_;
              if (*(char *)((long)in_R8 + lVar20) != '\0') {
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar20 + uVar27) == '\0') {
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                   img.accesses_._16_8_ + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar18 = img.img_._16_8_ + lVar18 * (long)pvVar14;
                  if (*(char *)(uVar27 + lVar18) != '\0') {
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                     -4 + uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar20 + -1 + uVar27) != '\0') goto LAB_00189671;
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                     -8 + uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar20 + -2 + uVar27) != '\0') {
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                       img.accesses_._16_8_ + -4 + uVar27 * 4);
                      *piVar1 = *piVar1 + 1;
                      bVar29 = *(char *)(lVar18 + -1 + uVar27) == '\0';
                      goto LAB_00188df8;
                    }
                  }
                  goto LAB_0018958f;
                }
                goto LAB_001886bf;
              }
              if ((lVar17 <= (long)(uVar27 + 2)) ||
                 (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + 8
                                  + uVar27 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar20 + 2 + uVar27) == '\0')) goto LAB_001886bf;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 + img.accesses_._16_8_
                              + (long)in_R8 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = img.img_._16_8_ + lVar18 * (long)pvVar14;
              if (*(char *)((long)in_R8 + lVar18) == '\0') {
                lVar20 = *(long *)img_labels.accesses_._72_8_;
LAB_00189956:
                piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + 8 +
                                uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + 8 + uVar27 * 4)
                ;
                goto LAB_0018997e;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                              uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar20 + uVar27) != '\0') goto LAB_001886bf;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 + img.accesses_._16_8_
                              + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar18 + uVar27) != '\0') {
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + -4
                                + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar20 + -1 + uVar27) != '\0') goto LAB_00189671;
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + -8
                                + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar20 + -2 + uVar27) == '\0') goto LAB_001899be;
                goto LAB_0018883c;
              }
              goto LAB_001899be;
            }
            piVar1 = (int *)(lVar22 + -4 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar21 + -1 + uVar27) == '\0') goto LAB_00188c8c;
            if (uVar28 == 0) goto LAB_001886bf;
            lVar22 = lVar20 * lVar26 + img.accesses_._16_8_;
            piVar1 = (int *)(lVar22 + (long)in_R8 * 4);
            *piVar1 = *piVar1 + 1;
            lVar21 = lVar18 * lVar26 + img.img_._16_8_;
            if (*(char *)((long)in_R8 + lVar21) != '\0') {
              piVar1 = (int *)(lVar23 + -8 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar13 + -2 + uVar27) != '\0') {
                piVar1 = (int *)(lVar22 + -4 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + -1 + uVar27) == '\0') {
                  piVar1 = (int *)(lVar22 + -8 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar21 + -2 + uVar27) != '\0') {
                    lVar13 = img.accesses_._16_8_ + lVar20 * (long)pvVar14;
                    piVar1 = (int *)(lVar13 + -4 + uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar20 = img.img_._16_8_ + lVar18 * (long)pvVar14;
                    if (*(char *)((uVar27 - 1) + lVar20) != '\0') {
                      piVar1 = (int *)(lVar22 + uVar27 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar21 + uVar27) == '\0') {
                        piVar1 = (int *)(lVar13 + uVar27 * 4);
                        *piVar1 = *piVar1 + 1;
                        goto LAB_00189272;
                      }
                      goto LAB_00189671;
                    }
                  }
                  goto LAB_0018958f;
                }
                piVar1 = (int *)(lVar22 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + uVar27) == '\0') goto LAB_0018838e;
                goto LAB_00189671;
              }
LAB_00189473:
              lVar20 = *(long *)img_labels.accesses_._72_8_;
              piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + uVar27 * 4);
LAB_0018997e:
              piVar1 = (int *)(lVar20 * uVar28 + img_labels.accesses_._16_8_ + -8 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = lVar18 * uVar28 + img_labels.img_._16_8_;
              goto LAB_00189991;
            }
            lVar24 = local_180;
            if ((lVar17 <= (long)(uVar27 + 2)) ||
               (piVar1 = (int *)(lVar22 + 8 + uVar27 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(lVar21 + 2 + uVar27) == '\0')) {
              piVar1 = (int *)(lVar22 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar21 + uVar27) == '\0') goto LAB_001886bf;
              piVar1 = (int *)(lVar23 + -8 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar13 + -2 + uVar27) == '\0') goto LAB_00189473;
              piVar1 = (int *)(lVar22 + -4 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar21 + -1 + uVar27) != '\0') goto LAB_00189671;
              piVar1 = (int *)(lVar22 + -8 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar21 + -2 + uVar27) == '\0') goto LAB_0018958f;
              piVar1 = (int *)(img.accesses_._16_8_ + lVar20 * (long)pvVar14 + -4 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_00188deb;
            }
            lVar19 = img.accesses_._16_8_ + lVar20 * (long)pvVar14;
            piVar1 = (int *)(lVar19 + (long)in_R8 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = img.img_._16_8_ + lVar18 * (long)pvVar14;
            if (*(char *)((long)in_R8 + lVar20) == '\0') {
              piVar1 = (int *)(lVar22 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar21 + uVar27) == '\0') goto LAB_0018993c;
              piVar1 = (int *)(lVar23 + -8 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar13 + -2 + uVar27) == '\0') {
LAB_00189a8e:
                lVar20 = *(long *)img_labels.accesses_._72_8_ * (long)pvVar14 +
                         img_labels.accesses_._16_8_;
                piVar1 = (int *)(lVar20 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)img_labels.img_._72_8_ * (long)pvVar14 + img_labels.img_._16_8_;
                uVar10 = *(uint *)(lVar18 + uVar27 * 4);
LAB_00189abe:
                piVar1 = (int *)(lVar20 + 8 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                uVar12 = *(uint *)(lVar18 + 8 + uVar27 * 4);
                in_R8 = pvVar14;
              }
              else {
                piVar1 = (int *)(lVar22 + -4 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + -1 + uVar27) != '\0') goto LAB_00189901;
                piVar1 = (int *)(lVar22 + -8 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar21 + -2 + uVar27) == '\0') goto LAB_00189a8e;
                piVar1 = (int *)(lVar19 + -4 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
LAB_00189881:
                lVar13 = *(long *)img_labels.accesses_._72_8_;
                lVar18 = lVar13 * (long)pvVar14 + img_labels.accesses_._16_8_;
                if (*(char *)(lVar20 + -1 + uVar27) != '\0') goto LAB_001898aa;
                piVar1 = (int *)(lVar18 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar20 = *(long *)img_labels.img_._72_8_ * (long)pvVar14 + img_labels.img_._16_8_;
                uVar10 = *(uint *)(lVar20 + uVar27 * 4);
LAB_00189a6b:
                piVar1 = (int *)(lVar18 + 8 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                uVar12 = *(uint *)(lVar20 + 8 + uVar27 * 4);
                in_R8 = pvVar14;
              }
              goto LAB_00189ac8;
            }
            piVar1 = (int *)(lVar23 + -8 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar13 + -2 + uVar27) == '\0') goto LAB_0018993c;
            piVar1 = (int *)(lVar22 + -4 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if ((*(char *)(lVar21 + -1 + uVar27) == '\0') &&
               ((piVar1 = (int *)(lVar22 + -8 + uVar27 * 4), *piVar1 = *piVar1 + 1,
                *(char *)(lVar21 + -2 + uVar27) == '\0' ||
                (piVar1 = (int *)(lVar19 + -4 + uVar27 * 4), *piVar1 = *piVar1 + 1,
                *(char *)(lVar20 + -1 + uVar27) == '\0')))) goto LAB_001899be;
            piVar1 = (int *)(lVar22 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar21 + uVar27) != '\0') goto LAB_00189671;
            piVar1 = (int *)(lVar19 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
LAB_00188ac5:
            cVar3 = *(char *)(lVar20 + uVar27);
LAB_00188aca:
            lVar20 = *(long *)img_labels.accesses_._72_8_;
            if (cVar3 == '\0') {
              piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + 8 + uVar27 * 4
                              );
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + 8 + uVar27 * 4);
              goto LAB_001891d9;
            }
            goto LAB_00189688;
          }
LAB_00188c8c:
          if (uVar28 == 0) goto LAB_00189176;
          lVar13 = lVar20 * lVar26 + img.accesses_._16_8_;
          piVar1 = (int *)(lVar13 + (long)in_R8 * 4);
          *piVar1 = *piVar1 + 1;
          lVar23 = lVar18 * lVar26 + img.img_._16_8_;
          if (*(char *)((long)in_R8 + lVar23) != '\0') {
LAB_00189157:
            lVar20 = *(long *)img_labels.accesses_._72_8_;
            goto LAB_0018862d;
          }
          if ((lVar17 <= (long)(uVar27 + 2)) ||
             (piVar1 = (int *)(lVar13 + 8 + uVar27 * 4), *piVar1 = *piVar1 + 1,
             *(char *)(lVar23 + 2 + uVar27) == '\0')) {
            piVar1 = (int *)(lVar13 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar23 + uVar27) == '\0') goto LAB_00189176;
            goto LAB_00189157;
          }
          piVar1 = (int *)(lVar13 + uVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar23 + uVar27) == '\0') {
            lVar20 = *(long *)img_labels.accesses_._72_8_;
            goto LAB_00188ead;
          }
          piVar1 = (int *)(img.accesses_._16_8_ + lVar20 * (long)pvVar14 + (long)in_R8 * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = *(long *)img_labels.accesses_._72_8_;
          lVar13 = lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_;
          if (*(char *)((long)in_R8 + img.img_._16_8_ + lVar18 * (long)pvVar14) != '\0') {
            piVar1 = (int *)(lVar13 + 8 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar18 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + 8 + uVar27 * 4);
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar20 * uVar28 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            goto LAB_0018865e;
          }
          piVar1 = (int *)(lVar13 + uVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = *(long *)img_labels.img_._72_8_ * (long)pvVar14 + img_labels.img_._16_8_;
          uVar10 = *(uint *)(lVar20 + uVar27 * 4);
          piVar1 = (int *)(lVar13 + 8 + uVar27 * 4);
          *piVar1 = *piVar1 + 1;
          uVar12 = *(uint *)(lVar20 + 8 + uVar27 * 4);
LAB_00189996:
          uVar10 = RemSP::MemMerge(uVar10,uVar12);
        }
        else {
LAB_001881bc:
          uVar11 = uVar27 | 1;
          if (lVar17 <= (long)uVar11) {
LAB_00188893:
            piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar28 +
                             img_labels.accesses_._16_8_ + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = *(long *)img_labels.img_._72_8_ * uVar28 + img_labels.img_._16_8_;
            uVar10 = 0;
            goto LAB_001896a7;
          }
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ +
                          uVar11 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar13 + uVar11) == '\0') {
            if ((lVar24 <= (long)uVar15) ||
               (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ +
                                uVar11 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(uVar11 + img.img_._16_8_ + lVar18 * uVar15) == '\0')) goto LAB_00188893;
          }
          else if (uVar28 != 0) {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                            uVar11 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = lVar18 * lVar26 + img.img_._16_8_;
            if (*(char *)(uVar11 + lVar20) == '\0') {
              if (((long)(uVar27 + 2) < lVar17) &&
                 (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + 8
                                  + uVar27 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar20 + 2 + uVar27) != '\0')) {
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar20 + uVar27) == '\0') {
LAB_00188e97:
                  lVar20 = *(long *)img_labels.accesses_._72_8_;
LAB_00188ead:
                  piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + 8 +
                                  uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + 8 +
                                    uVar27 * 4);
                  goto LAB_00188653;
                }
                goto LAB_00188561;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                              uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)(lVar20 + uVar27) == '\0') goto LAB_00188bdf;
            }
LAB_00188617:
            lVar20 = *(long *)img_labels.accesses_._72_8_;
LAB_0018862d:
            piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar18 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + uVar27 * 4);
            goto LAB_00188653;
          }
LAB_00188bdf:
          uVar10 = RemSP::MemNewLabel();
        }
LAB_00188be8:
        piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar28 + img_labels.accesses_._16_8_
                        + uVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar20 = *(long *)img_labels.img_._72_8_ * uVar28 + img_labels.img_._16_8_;
      }
      else {
        if (uVar27 != 0) {
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ + -4 +
                          uVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar13 + -1 + uVar27) == '\0') {
            if ((lVar24 <= (long)uVar15) ||
               (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar15 + img.accesses_._16_8_ + -4
                                + uVar27 * 4), *piVar1 = *piVar1 + 1,
               *(char *)((uVar27 - 1) + lVar18 * uVar15 + img.img_._16_8_) == '\0'))
            goto LAB_001883ba;
            uVar11 = uVar27 | 1;
            if ((long)uVar11 < lVar17) {
              if (uVar28 == 0) {
LAB_0018898c:
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ +
                                uVar11 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar13 + uVar11) == '\0') goto LAB_00188b13;
                if (lVar17 <= (long)(uVar27 + 2)) {
                  if (uVar28 == 0) goto LAB_001886bf;
LAB_00188eea:
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                   -4 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  in_R8 = (void *)(lVar18 * lVar26 + img.img_._16_8_);
                  if (*(char *)((uVar27 - 1) + (long)in_R8) != '\0') {
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ +
                                     -8 + uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar20 = *(long *)img_labels.accesses_._72_8_;
                    if (*(char *)(lVar13 + -2 + uVar27) == '\0') {
                      piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + -8 +
                                      uVar27 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar18 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + -8 +
                                        uVar27 * 4);
                      piVar1 = (int *)(lVar20 * uVar28 + img_labels.accesses_._16_8_ + -8 +
                                      uVar27 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar20 = lVar18 * uVar28 + img_labels.img_._16_8_;
                      goto LAB_00189991;
                    }
                    goto LAB_001886d6;
                  }
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                  uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)((long)in_R8 + uVar27) == '\0') goto LAB_001886bf;
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ +
                                   -8 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((*(char *)(lVar13 + -2 + uVar27) == '\0') ||
                     (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_
                                       + -8 + uVar27 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)((long)in_R8 + (uVar27 - 2)) == '\0')) goto LAB_00189473;
                  lVar20 = *(long *)img.accesses_._72_8_;
                  goto LAB_00188dda;
                }
                if (uVar28 == 0) {
LAB_001886bf:
                  lVar20 = *(long *)img_labels.accesses_._72_8_;
LAB_001886d6:
                  lVar18 = img_labels.accesses_._16_8_ + lVar20 * uVar28;
                  piVar1 = (int *)(lVar18 + -8 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar20 = *(long *)img_labels.img_._72_8_ * uVar28 + img_labels.img_._16_8_;
                  uVar10 = *(uint *)(lVar20 + -8 + uVar27 * 4);
                  piVar1 = (int *)(lVar18 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  goto LAB_001896a7;
                }
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + 8 +
                                uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar23 = img.img_._16_8_ + lVar18 * lVar26;
                if (*(char *)(uVar27 + 2 + lVar23) == '\0') goto LAB_00188eea;
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ + -8
                                + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar20 = *(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_;
                if (*(char *)(lVar13 + -2 + uVar27) == '\0') {
                  piVar1 = (int *)(lVar20 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar23 + uVar27) == '\0') {
                    in_R8 = (void *)(*(long *)img.accesses_._72_8_ * lVar26);
                    piVar1 = (int *)((long)in_R8 + uVar27 * 4 + img.accesses_._16_8_ + -4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar23 + -1 + uVar27) != '\0') {
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                       img.accesses_._16_8_ + uVar11 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar20 = img.img_._16_8_ + lVar18 * (long)pvVar14;
                      if (*(char *)(uVar11 + lVar20) == '\0') {
                        lVar20 = *(long *)img_labels.accesses_._72_8_ * (long)pvVar14 +
                                 img_labels.accesses_._16_8_;
                        piVar1 = (int *)(lVar20 + -8 + uVar27 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar18 = *(long *)img_labels.img_._72_8_ * (long)pvVar14 +
                                 img_labels.img_._16_8_;
                        uVar10 = *(uint *)(lVar18 + -8 + uVar27 * 4);
                        goto LAB_00189abe;
                      }
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                       img.accesses_._16_8_ + uVar27 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar13 = *(long *)img_labels.accesses_._72_8_;
                      lVar18 = lVar13 * (long)pvVar14 + img_labels.accesses_._16_8_;
                      if (*(char *)(lVar20 + uVar27) == '\0') {
                        piVar1 = (int *)(lVar18 + -8 + uVar27 * 4);
                        *piVar1 = *piVar1 + 1;
                        lVar20 = *(long *)img_labels.img_._72_8_ * (long)pvVar14 +
                                 img_labels.img_._16_8_;
                        uVar10 = *(uint *)(lVar20 + -8 + uVar27 * 4);
                        goto LAB_00189a6b;
                      }
LAB_001898aa:
                      piVar1 = (int *)(lVar18 + 8 + uVar27 * 4);
                      *piVar1 = *piVar1 + 1;
                      lVar20 = *(long *)img_labels.img_._72_8_;
                      uVar10 = *(uint *)(lVar20 * (long)pvVar14 + img_labels.img_._16_8_ + 8 +
                                        uVar27 * 4);
                      in_R8 = pvVar14;
                      goto LAB_00189134;
                    }
LAB_0018993c:
                    lVar20 = *(long *)img_labels.accesses_._72_8_;
                    goto LAB_00189956;
                  }
                  piVar1 = (int *)(img.accesses_._16_8_ +
                                   *(long *)img.accesses_._72_8_ * (long)pvVar14 + uVar11 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar20 = *(long *)img_labels.accesses_._72_8_;
                  in_R8 = (void *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_);
                  if (*(char *)(uVar11 + img.img_._16_8_ + lVar18 * (long)pvVar14) == '\0') {
                    piVar1 = (int *)((long)in_R8 + uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar20 = *(long *)img_labels.img_._72_8_ * (long)pvVar14 +
                             img_labels.img_._16_8_;
                    uVar10 = *(uint *)(lVar20 + uVar27 * 4);
                    piVar1 = (int *)((long)in_R8 + uVar27 * 4 + 8);
                    *piVar1 = *piVar1 + 1;
                    uVar10 = RemSP::MemMerge(uVar10,*(uint *)(lVar20 + 8 + uVar27 * 4));
                    piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar28 +
                                     img_labels.accesses_._16_8_ + -8 + uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    uVar12 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar28 +
                                       img_labels.img_._16_8_ + -8 + uVar27 * 4);
                    goto LAB_00189996;
                  }
                  piVar1 = (int *)((long)in_R8 + uVar27 * 4 + 8);
                  *piVar1 = *piVar1 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + 8 +
                                    uVar27 * 4);
                  piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar20 * uVar28 + -8 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar20 = lVar18 * uVar28 + img_labels.img_._16_8_;
LAB_00189991:
                  uVar12 = *(uint *)(lVar20 + -8 + uVar27 * 4);
                  goto LAB_00189996;
                }
                piVar1 = (int *)(lVar20 + -4 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                cVar3 = *(char *)(lVar23 + -1 + uVar27);
                in_R8 = (void *)CONCAT71((int7)((ulong)lVar20 >> 8),cVar3);
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                 img.accesses_._16_8_ + uVar11 * 4);
                *piVar1 = *piVar1 + 1;
                lVar20 = img.img_._16_8_ + lVar18 * (long)pvVar14;
                if (cVar3 != '\0') {
                  if (*(char *)(uVar11 + lVar20) == '\0') goto LAB_0018993c;
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                  uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar3 = *(char *)(lVar23 + uVar27);
joined_r0x0018966b:
                  if (cVar3 == '\0') {
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                     img.accesses_._16_8_ + uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_00188ac5;
                  }
                  goto LAB_00189671;
                }
                lVar18 = *(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_;
                if (*(char *)(uVar11 + lVar20) != '\0') {
                  piVar1 = (int *)(lVar18 + -8 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((*(char *)(lVar23 + -2 + uVar27) == '\0') ||
                     (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                       img.accesses_._16_8_ + -4 + uVar27 * 4),
                     *piVar1 = *piVar1 + 1, *(char *)(lVar20 + -1 + uVar27) == '\0'))
                  goto LAB_001899be;
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                  uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  cVar3 = *(char *)(lVar23 + uVar27);
                  goto joined_r0x0018966b;
                }
                piVar1 = (int *)(lVar18 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar23 + uVar27) != '\0') {
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                   -8 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar23 + -2 + uVar27) != '\0') {
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                     img.accesses_._16_8_ + -4 + uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    goto LAB_00189881;
                  }
                  goto LAB_00189a8e;
                }
LAB_00189901:
                lVar20 = *(long *)img_labels.accesses_._72_8_;
                piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + 8 +
                                uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)img_labels.img_._72_8_;
                in_R8 = pvVar14;
LAB_001899f4:
                uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + 8 + uVar27 * 4)
                ;
                goto LAB_001899fc;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                              uVar11 * 4);
              *piVar1 = *piVar1 + 1;
              lVar23 = lVar18 * lVar26 + img.img_._16_8_;
              if (*(char *)(uVar11 + lVar23) == '\0') goto LAB_0018898c;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ + -8 +
                              uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = *(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_;
              if (*(char *)(lVar13 + -2 + uVar27) != '\0') {
                piVar1 = (int *)(lVar20 + -4 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar20 = *(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_;
                if (*(char *)(lVar23 + -1 + uVar27) == '\0') {
                  piVar1 = (int *)(lVar20 + -8 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  if (*(char *)(lVar23 + -2 + uVar27) != '\0') {
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                     img.accesses_._16_8_ + -4 + uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    lVar20 = img.img_._16_8_ + lVar18 * (long)pvVar14;
                    if (*(char *)((uVar27 - 1) + lVar20) != '\0') {
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_
                                      + uVar27 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar23 + uVar27) != '\0') goto LAB_00189671;
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                       img.accesses_._16_8_ + uVar27 * 4);
                      *piVar1 = *piVar1 + 1;
LAB_00189272:
                      bVar29 = *(char *)(lVar20 + uVar27) == '\0';
                      goto LAB_00188df8;
                    }
                  }
                  goto LAB_0018958f;
                }
                piVar1 = (int *)(lVar20 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar23 + uVar27) != '\0') goto LAB_00189671;
LAB_0018838e:
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                 img.accesses_._16_8_ + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                bVar29 = *(char *)(uVar27 + img.img_._16_8_ + lVar18 * (long)pvVar14) == '\0';
                goto LAB_00188df8;
              }
              piVar1 = (int *)(lVar20 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if ((*(char *)(lVar23 + uVar27) != '\0') ||
                 (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                   -4 + uVar27 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar23 + -1 + uVar27) == '\0')) goto LAB_0018958f;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 + img.accesses_._16_8_
                              + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar13 = *(long *)img_labels.accesses_._72_8_;
              lVar20 = lVar13 * (long)pvVar14 + img_labels.accesses_._16_8_;
              if (*(char *)(uVar27 + img.img_._16_8_ + lVar18 * (long)pvVar14) == '\0') {
                piVar1 = (int *)(lVar20 + -8 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)img_labels.img_._72_8_ * (long)pvVar14 + img_labels.img_._16_8_;
                uVar10 = *(uint *)(lVar18 + -8 + uVar27 * 4);
                piVar1 = (int *)(lVar20 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                uVar12 = *(uint *)(lVar18 + uVar27 * 4);
LAB_00189ac8:
                uVar10 = RemSP::MemMerge(uVar10,uVar12);
                piVar1 = (int *)(*(long *)img_labels.accesses_._72_8_ * uVar28 +
                                 img_labels.accesses_._16_8_ + -8 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                uVar12 = *(uint *)(*(long *)img_labels.img_._72_8_ * uVar28 + img_labels.img_._16_8_
                                   + -8 + uVar27 * 4);
                goto LAB_00189a14;
              }
              piVar1 = (int *)(lVar20 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(uint *)(lVar20 * (long)pvVar14 + img_labels.img_._16_8_ + uVar27 * 4);
LAB_00189134:
              piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar13 * uVar28 + -8 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = lVar20 * uVar28 + img_labels.img_._16_8_;
            }
            else {
LAB_00188b13:
              if (uVar28 == 0) goto LAB_00189671;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + -4 +
                              uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = lVar18 * lVar26 + img.img_._16_8_;
              if (*(char *)((uVar27 - 1) + lVar20) == '\0') {
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                if (*(char *)(lVar20 + uVar27) != '\0') {
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ +
                                   -8 + uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  if ((*(char *)(lVar13 + -2 + uVar27) != '\0') &&
                     (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_
                                       + -8 + uVar27 * 4), *piVar1 = *piVar1 + 1,
                     *(char *)(lVar20 + -2 + uVar27) != '\0')) goto LAB_00188dcf;
                  goto LAB_0018958f;
                }
                goto LAB_00189671;
              }
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ + -8 +
                              uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = *(long *)img_labels.accesses_._72_8_;
              if (*(char *)(lVar13 + -2 + uVar27) != '\0') goto LAB_00189688;
              piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + -8 +
                              uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)img_labels.img_._72_8_;
              uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + -8 + uVar27 * 4);
LAB_001891d9:
              piVar1 = (int *)(lVar20 * uVar28 + img_labels.accesses_._16_8_ + -8 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = lVar18 * uVar28 + img_labels.img_._16_8_;
            }
          }
          else {
            uVar11 = uVar27 | 1;
            if (lVar17 <= (long)uVar11) goto LAB_00189671;
            lVar20 = *(long *)img.img_._72_8_;
            if (uVar28 == 0) {
LAB_001886fa:
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ +
                              uVar11 * 4);
              *piVar1 = *piVar1 + 1;
              if (((*(char *)(uVar11 + lVar20 * uVar28 + img.img_._16_8_) != '\0') && (uVar28 != 0))
                 && ((long)(uVar27 + 2) < lVar17)) {
                piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + 8 +
                                uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar13 = lVar20 * lVar26 + img.img_._16_8_;
                if (*(char *)(uVar27 + 2 + lVar13) != '\0') {
                  piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                   img.accesses_._16_8_ + uVar11 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar18 = img.img_._16_8_ + lVar20 * (long)pvVar14;
                  if (*(char *)(uVar11 + lVar18) != '\0') {
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                                    uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar13 + uVar27) != '\0') goto LAB_00189671;
                    piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                     img.accesses_._16_8_ + uVar27 * 4);
                    *piVar1 = *piVar1 + 1;
                    if (*(char *)(lVar18 + uVar27) != '\0') {
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_
                                       + -4 + uVar27 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar13 + -1 + uVar27) != '\0') goto LAB_00189671;
                      piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_
                                       + -8 + uVar27 * 4);
                      *piVar1 = *piVar1 + 1;
                      if (*(char *)(lVar13 + -2 + uVar27) != '\0') {
LAB_0018883c:
                        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                         img.accesses_._16_8_ + -4 + uVar27 * 4);
                        *piVar1 = *piVar1 + 1;
                        cVar3 = *(char *)(lVar18 + -1 + uVar27);
                        goto LAB_00188aca;
                      }
                    }
                  }
LAB_001899be:
                  lVar20 = *(long *)img_labels.accesses_._72_8_;
                  piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + 8 +
                                  uVar27 * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar18 = *(long *)img_labels.img_._72_8_;
                  goto LAB_001899f4;
                }
              }
LAB_00189671:
              lVar20 = *(long *)img_labels.accesses_._72_8_;
LAB_00189688:
              lVar18 = img_labels.accesses_._16_8_ + lVar20 * uVar28;
              piVar1 = (int *)(lVar18 + -8 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = *(long *)img_labels.img_._72_8_ * uVar28 + img_labels.img_._16_8_;
              uVar10 = *(uint *)(lVar20 + -8 + uVar27 * 4);
              piVar1 = (int *)(lVar18 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              goto LAB_001896a7;
            }
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                            uVar11 * 4);
            *piVar1 = *piVar1 + 1;
            lVar18 = lVar20 * lVar26 + img.img_._16_8_;
            if (*(char *)(uVar11 + lVar18) == '\0') goto LAB_001886fa;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                            uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (*(char *)(lVar18 + uVar27) != '\0') goto LAB_00189671;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 + img.accesses_._16_8_ +
                            uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = *(long *)img.img_._72_8_;
            if (*(char *)(uVar27 + lVar20 * (long)pvVar14 + img.img_._16_8_) != '\0') {
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + -4 +
                              uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              if (*(char *)((uVar27 - 1) + img.img_._16_8_ + lVar20 * lVar26) != '\0')
              goto LAB_00189671;
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + -8 +
                              uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)img.img_._72_8_;
              if (*(char *)((uVar27 - 2) + lVar18 * lVar26 + img.img_._16_8_) == '\0')
              goto LAB_0018958f;
LAB_00188dcf:
              lVar20 = *(long *)img.accesses_._72_8_;
LAB_00188dda:
              piVar1 = (int *)(lVar20 * (long)pvVar14 + img.accesses_._16_8_ + -4 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
LAB_00188deb:
              bVar29 = *(char *)((uVar27 - 1) + img.img_._16_8_ + lVar18 * (long)pvVar14) == '\0';
LAB_00188df8:
              lVar20 = *(long *)img_labels.accesses_._72_8_;
              if (bVar29) {
                piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)img_labels.img_._72_8_;
                uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + uVar27 * 4);
                goto LAB_001891d9;
              }
              goto LAB_00189688;
            }
LAB_0018958f:
            lVar20 = *(long *)img_labels.accesses_._72_8_;
            piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar18 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + uVar27 * 4);
LAB_001899fc:
            piVar1 = (int *)(lVar20 * uVar28 + img_labels.accesses_._16_8_ + -8 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = lVar18 * uVar28 + img_labels.img_._16_8_;
          }
          uVar12 = *(uint *)(lVar20 + -8 + uVar27 * 4);
LAB_00189a14:
          uVar10 = RemSP::MemMerge(uVar10,uVar12);
          goto LAB_00188be8;
        }
LAB_001883ba:
        uVar11 = uVar27 | 1;
        if ((long)uVar11 < lVar17) {
          if (uVar28 != 0) {
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                            uVar11 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = lVar18 * lVar26 + img.img_._16_8_;
            if (*(char *)(uVar11 + lVar20) == '\0') goto LAB_001884c9;
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                            uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            if (((*(char *)(lVar20 + uVar27) == '\0') && (uVar27 != 0)) &&
               ((piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + -4
                                 + uVar27 * 4), *piVar1 = *piVar1 + 1,
                *(char *)(lVar20 + -1 + uVar27) != '\0' &&
                (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                  img.accesses_._16_8_ + uVar27 * 4), *piVar1 = *piVar1 + 1,
                *(char *)(uVar27 + img.img_._16_8_ + lVar18 * (long)pvVar14) == '\0')))) {
              lVar20 = *(long *)img_labels.accesses_._72_8_ * (long)pvVar14 +
                       img_labels.accesses_._16_8_;
              piVar1 = (int *)(lVar20 + -8 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              lVar18 = *(long *)img_labels.img_._72_8_ * (long)pvVar14 + img_labels.img_._16_8_;
              uVar10 = *(uint *)(lVar18 + -8 + uVar27 * 4);
              piVar1 = (int *)(lVar20 + uVar27 * 4);
              *piVar1 = *piVar1 + 1;
              uVar12 = *(uint *)(lVar18 + uVar27 * 4);
              goto LAB_00189a14;
            }
            goto LAB_00188617;
          }
LAB_001884c9:
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * uVar28 + img.accesses_._16_8_ +
                          uVar11 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar13 + uVar11) == '\0') goto LAB_001885e1;
          if (lVar17 <= (long)(uVar27 + 2)) {
            if (uVar28 == 0) goto LAB_00188bdf;
LAB_0018894a:
            piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                            uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = img.img_._16_8_ + lVar18 * lVar26;
            if (*(char *)(uVar27 + lVar20) != '\0') goto LAB_00188617;
            if (uVar28 == 0 || uVar27 == 0) goto LAB_00188bdf;
            goto LAB_001888cf;
          }
          if (uVar28 == 0) goto LAB_00188bdf;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + 8 +
                          uVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = img.img_._16_8_ + lVar18 * lVar26;
          if (*(char *)(uVar27 + 2 + lVar20) == '\0') goto LAB_0018894a;
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ +
                          uVar27 * 4);
          *piVar1 = *piVar1 + 1;
          if (*(char *)(lVar20 + uVar27) == '\0') {
            if ((uVar27 != 0) &&
               (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + -4
                                + uVar27 * 4), *piVar1 = *piVar1 + 1,
               *(char *)(lVar20 + -1 + uVar27) != '\0')) {
              piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 + img.accesses_._16_8_
                              + uVar11 * 4);
              *piVar1 = *piVar1 + 1;
              lVar20 = img.img_._16_8_ + lVar18 * (long)pvVar14;
              if ((*(char *)(uVar11 + lVar20) == '\0') ||
                 (piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 +
                                   img.accesses_._16_8_ + uVar27 * 4), *piVar1 = *piVar1 + 1,
                 *(char *)(lVar20 + uVar27) == '\0')) {
                lVar20 = *(long *)img_labels.accesses_._72_8_ * (long)pvVar14 +
                         img_labels.accesses_._16_8_;
                piVar1 = (int *)(lVar20 + -8 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                lVar18 = *(long *)img_labels.img_._72_8_ * (long)pvVar14 + img_labels.img_._16_8_;
                uVar10 = *(uint *)(lVar18 + -8 + uVar27 * 4);
                piVar1 = (int *)(lVar20 + 8 + uVar27 * 4);
                *piVar1 = *piVar1 + 1;
                uVar12 = *(uint *)(lVar18 + 8 + uVar27 * 4);
                goto LAB_00189a14;
              }
            }
            goto LAB_00188e97;
          }
LAB_00188561:
          piVar1 = (int *)(*(long *)img.accesses_._72_8_ * (long)pvVar14 + img.accesses_._16_8_ +
                          (uVar27 | 1) * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = *(long *)img_labels.accesses_._72_8_;
          lVar13 = lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_;
          if (*(char *)((uVar27 | 1) + img.img_._16_8_ + lVar18 * (long)pvVar14) != '\0') {
            piVar1 = (int *)(lVar13 + 8 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar18 = *(long *)img_labels.img_._72_8_;
            uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + 8 + uVar27 * 4);
            piVar1 = (int *)(img_labels.accesses_._16_8_ + lVar20 * uVar28 + uVar27 * 4);
            *piVar1 = *piVar1 + 1;
            lVar20 = lVar18 * uVar28 + img_labels.img_._16_8_;
            goto LAB_001896a7;
          }
          piVar1 = (int *)(lVar13 + uVar27 * 4);
          *piVar1 = *piVar1 + 1;
          lVar20 = *(long *)img_labels.img_._72_8_ * (long)pvVar14 + img_labels.img_._16_8_;
          uVar10 = *(uint *)(lVar20 + uVar27 * 4);
          piVar1 = (int *)(lVar13 + 8 + uVar27 * 4);
          *piVar1 = *piVar1 + 1;
          uVar12 = *(uint *)(lVar20 + 8 + uVar27 * 4);
          goto LAB_00189a14;
        }
LAB_001885e1:
        if (uVar28 == 0) goto LAB_00188bdf;
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + uVar27 * 4)
        ;
        *piVar1 = *piVar1 + 1;
        lVar20 = img.img_._16_8_ + lVar18 * lVar26;
        if (*(char *)(uVar27 + lVar20) != '\0') goto LAB_00188617;
        if (uVar27 == 0) goto LAB_00188bdf;
LAB_001888cf:
        piVar1 = (int *)(*(long *)img.accesses_._72_8_ * lVar26 + img.accesses_._16_8_ + -4 +
                        uVar27 * 4);
        *piVar1 = *piVar1 + 1;
        if (*(char *)(lVar20 + -1 + uVar27) == '\0') goto LAB_00188bdf;
        lVar20 = *(long *)img_labels.accesses_._72_8_;
        piVar1 = (int *)(lVar20 * (long)pvVar14 + img_labels.accesses_._16_8_ + -8 + uVar27 * 4);
        *piVar1 = *piVar1 + 1;
        lVar18 = *(long *)img_labels.img_._72_8_;
        uVar10 = *(uint *)(lVar18 * (long)pvVar14 + img_labels.img_._16_8_ + -8 + uVar27 * 4);
LAB_00188653:
        piVar1 = (int *)(lVar20 * uVar28 + img_labels.accesses_._16_8_ + uVar27 * 4);
        *piVar1 = *piVar1 + 1;
LAB_0018865e:
        lVar20 = lVar18 * uVar28 + img_labels.img_._16_8_;
      }
LAB_001896a7:
      *(uint *)(lVar20 + uVar27 * 4) = uVar10;
    }
    uVar28 = uVar28 + 2;
  } while( true );
}

Assistant:

void PerformLabelingMem(std::vector<uint64_t>& accesses)
    {
        const int h = img_.rows;
        const int w = img_.cols;

        LabelsSolver::MemAlloc(UPPER_BOUND_8_CONNECTIVITY);
        LabelsSolver::MemSetup();

        //Data structure for memory test
        MemMat<unsigned char> img(img_);
        MemMat<int> img_labels(img_.size(), 0);

        // We work with 2x2 blocks
        // +-+-+-+
        // |P|Q|R|
        // +-+-+-+
        // |S|X|
        // +-+-+

        // The pixels are named as follows
        // +---+---+---+
        // |a b|c d|e f|
        // |g h|i j|k l|
        // +---+---+---+
        // |m n|o p|
        // |q r|s t|
        // +---+---+

        // Pixels a, f, l, q are not needed, since we need to understand the
        // the connectivity between these blocks and those pixels only metter
        // when considering the outer connectivities

        // A bunch of defines used to check if the pixels are foreground,
        // without going outside the image limits.

        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img(r-2, c-1)>0
#define CONDITION_C r-2>=0 && img(r-2, c)>0
#define CONDITION_D c+1<w && r-2>=0 && img(r-2, c+1)>0
#define CONDITION_E c+2<w && r-2>=0 && img(r-2, c+2)>0

#define CONDITION_G c-2>=0 && r-1>=0 && img(r-1, c-2)>0
#define CONDITION_H c-1>=0 && r-1>=0 && img(r-1, c-1)>0
#define CONDITION_I r-1>=0 && img(r-1, c)>0
#define CONDITION_J c+1<w && r-1>=0 && img(r-1, c+1)>0
#define CONDITION_K c+2<w && r-1>=0 && img(r-1, c+2)>0

#define CONDITION_M c-2>=0 && img(r, c-2)>0
#define CONDITION_N c-1>=0 && img(r, c-1)>0
#define CONDITION_O img(r,c)>0
#define CONDITION_P c+1<w && img(r,c+1)>0

#define CONDITION_R c-1>=0 && r+1<h && img(r+1, c-1)>0
#define CONDITION_S r+1<h && img(r+1, c)>0
#define CONDITION_T c+1<w && r+1<h && img(r+1, c+1)>0

                // Action 1: No action
#define ACTION_1 img_labels(r, c) = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels(r, c) = LabelsSolver::MemNewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels(r, c) = img_labels(r - 2, c - 2); continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels(r, c) = img_labels(r - 2, c); continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels(r, c) = img_labels(r - 2, c + 2); continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels(r, c) = img_labels(r, c - 2); continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r, c - 2)); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r, c - 2)); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels(r, c) = LabelsSolver::MemMerge(img_labels(r - 2, c + 2), img_labels(r, c - 2)); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c)), img_labels(r, c - 2)); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c - 2), img_labels(r - 2, c + 2)), img_labels(r, c - 2)); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels(r, c) = LabelsSolver::MemMerge(LabelsSolver::MemMerge(img_labels(r - 2, c), img_labels(r - 2, c + 2)), img_labels(r, c - 2)); continue;

#include "labeling_grana_2010_tree.inc.h"
            }
        }

        n_labels_ = LabelsSolver::MemFlatten();

        // Second scan
        for (int r = 0; r < h; r += 2) {
            for (int c = 0; c < w; c += 2) {
                int iLabel = img_labels(r, c);
                if (iLabel > 0) {
                    iLabel = LabelsSolver::MemGetLabel(iLabel);
                    if (img(r, c) > 0)
                        img_labels(r, c) = iLabel;
                    else
                        img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        if (img(r, c + 1) > 0)
                            img_labels(r, c + 1) = iLabel;
                        else
                            img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            if (img(r + 1, c) > 0)
                                img_labels(r + 1, c) = iLabel;
                            else
                                img_labels(r + 1, c) = 0;
                            if (img(r + 1, c + 1) > 0)
                                img_labels(r + 1, c + 1) = iLabel;
                            else
                                img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        if (img(r + 1, c) > 0)
                            img_labels(r + 1, c) = iLabel;
                        else
                            img_labels(r + 1, c) = 0;
                    }
                }
                else {
                    img_labels(r, c) = 0;
                    if (c + 1 < w) {
                        img_labels(r, c + 1) = 0;
                        if (r + 1 < h) {
                            img_labels(r + 1, c) = 0;
                            img_labels(r + 1, c + 1) = 0;
                        }
                    }
                    else if (r + 1 < h) {
                        img_labels(r + 1, c) = 0;
                    }
                }
            }
        }

        // Store total accesses in the output vector 'accesses'
        accesses = std::vector<uint64_t>((int)MD_SIZE, 0);

        accesses[MD_BINARY_MAT] = (uint64_t)img.GetTotalAccesses();
        accesses[MD_LABELED_MAT] = (uint64_t)img_labels.GetTotalAccesses();
        accesses[MD_EQUIVALENCE_VEC] = (uint64_t)LabelsSolver::MemTotalAccesses();

        img_labels_ = img_labels.GetImage();

        LabelsSolver::MemDealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }